

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O1

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setVertexName(Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,string *newName,int index)

{
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar1;
  pointer pcVar2;
  long *local_40 [2];
  long local_30 [2];
  
  if ((-1 < index) && (index < this->vertexCount)) {
    pGVar1 = this->vertexList;
    pcVar2 = (newName->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + newName->_M_string_length);
    std::__cxx11::string::_M_assign((string *)&pGVar1[(uint)index].name);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void Graph<T>::setVertexName(std::string newName, int index)
{
  //set the name for the vertex at the passed index if the index is valid
  if(index >= 0 && index < vertexCount)
  {
    vertexList[index].setName(newName);
  }
}